

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O0

void __thiscall
RateCodingSynapse::initialize(RateCodingSynapse *this,Population *n_from,Population *n_to)

{
  undefined4 uVar1;
  ostream *this_00;
  undefined8 *puVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  size_type __n;
  ValueEvent *this_01;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  int i;
  value_type *in_stack_ffffffffffffff38;
  vector<Event_*,_std::allocator<Event_*>_> *in_stack_ffffffffffffff40;
  allocator_type *__a;
  allocator_type local_89 [25];
  deque<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  int local_1c;
  
  uVar1 = (**(code **)(*in_RSI + 0x18))();
  *(undefined4 *)(in_RDI + 0x58) = uVar1;
  uVar1 = (**(code **)(*in_RDX + 0x10))();
  *(undefined4 *)(in_RDI + 0x5c) = uVar1;
  if (*(int *)(in_RDI + 0x5c) == 1) {
    *(undefined1 *)(in_RDI + 0x68) = 1;
  }
  else if (*(int *)(in_RDI + 0x58) != *(int *)(in_RDI + 0x5c)) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Number of input neurons not equal to number of output neurons");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Number of input neurons not equal to number of output neurons";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  *(long **)(in_RDI + 8) = in_RSI;
  *(long **)(in_RDI + 0x10) = in_RDX;
  pCVar3 = Clock::getInstance();
  *(Clock **)(in_RDI + 0x38) = pCVar3;
  pLVar4 = Logging::getInstance();
  *(Logging **)(in_RDI + 0x60) = pLVar4;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x58); local_1c = local_1c + 1) {
    __n = in_RDI + 0x40;
    this_01 = (ValueEvent *)operator_new(0x20);
    ValueEvent::ValueEvent(this_01);
    std::vector<Event_*,_std::allocator<Event_*>_>::push_back
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff40 = (vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x20);
    __a = local_89;
    std::allocator<double>::allocator((allocator<double> *)0x171626);
    std::deque<double,_std::allocator<double>_>::deque
              ((deque<double,_std::allocator<double>_> *)this_01,__n,__a);
    std::
    vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
    ::assign((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
              *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
             (value_type *)0x17164f);
    std::deque<double,_std::allocator<double>_>::~deque(in_stack_ffffffffffffff90);
    std::allocator<double>::~allocator((allocator<double> *)0x171665);
  }
  return;
}

Assistant:

void RateCodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfOutputNeurons();
    outputSize = n_to->getNumberOfInputNeurons();
    if(outputSize == 1) {
        singleOutput = true;
    }
    else if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new ValueEvent());
        spikes.assign(inputSize, deque<double>(0));
    }
}